

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
kj::Vector<kj::TreeMap<int,_kj::StringPtr>::Entry>::setCapacity
          (Vector<kj::TreeMap<int,_kj::StringPtr>::Entry> *this,size_t newSize)

{
  RemoveConst<kj::StringPtr> *pRVar1;
  StringPtr *pSVar2;
  StringPtr *pSVar3;
  ulong uVar4;
  size_t __n;
  ArrayBuilder<kj::StringPtr> newBuilder;
  ArrayBuilder<kj::StringPtr> local_48;
  
  uVar4 = (*(long *)(this + 8) - *(long *)this >> 3) * -0x5555555555555555;
  if (newSize <= uVar4 && uVar4 - newSize != 0) {
    *(size_t *)(this + 8) = *(long *)this + newSize * 0x18;
  }
  pSVar3 = (StringPtr *)
           _::HeapArrayDisposer::allocateImpl
                     (0x18,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_48.endPtr = (StringPtr *)((long)pSVar3 + newSize * 0x18);
  local_48.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  __n = *(long *)(this + 8) - (long)*(void **)this;
  local_48.ptr = pSVar3;
  if (__n != 0) {
    local_48.pos = pSVar3;
    memcpy(pSVar3,*(void **)this,__n);
  }
  local_48.pos = (RemoveConst<kj::StringPtr> *)((long)pSVar3 + __n);
  ArrayBuilder<kj::TreeMap<int,_kj::StringPtr>::Entry>::operator=
            ((ArrayBuilder<kj::TreeMap<int,_kj::StringPtr>::Entry> *)this,&local_48);
  pSVar2 = local_48.endPtr;
  pRVar1 = local_48.pos;
  pSVar3 = local_48.ptr;
  if (local_48.ptr != (StringPtr *)0x0) {
    local_48.ptr = (StringPtr *)0x0;
    local_48.pos = (RemoveConst<kj::StringPtr> *)0x0;
    local_48.endPtr = (StringPtr *)0x0;
    (**(local_48.disposer)->_vptr_ArrayDisposer)
              (local_48.disposer,pSVar3,0x18,
               ((long)pRVar1 - (long)pSVar3 >> 3) * -0x5555555555555555,
               ((long)pSVar2 - (long)pSVar3 >> 3) * -0x5555555555555555,0);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }